

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall spirv_cross::CompilerMSL::get_uint_type_id(CompilerMSL *this)

{
  uint32_t uVar1;
  undefined1 local_178 [8];
  SPIRType type;
  CompilerMSL *this_local;
  
  if (this->uint_type_id == 0) {
    type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)this;
    uVar1 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    this->uint_type_id = uVar1;
    SPIRType::SPIRType((SPIRType *)local_178,OpTypeInt);
    type.super_IVariant.self.id = 8;
    type.super_IVariant._12_4_ = 0x20;
    Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
              ((Compiler *)this,this->uint_type_id,(SPIRType *)local_178);
    this_local._4_4_ = this->uint_type_id;
    SPIRType::~SPIRType((SPIRType *)local_178);
  }
  else {
    this_local._4_4_ = this->uint_type_id;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::get_uint_type_id()
{
	if (uint_type_id != 0)
		return uint_type_id;

	uint_type_id = ir.increase_bound_by(1);

	SPIRType type { OpTypeInt };
	type.basetype = SPIRType::UInt;
	type.width = 32;
	set<SPIRType>(uint_type_id, type);
	return uint_type_id;
}